

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

CharPtr fmt::BasicWriter<wchar_t>::fill_padding
                  (CharPtr buffer,uint total_size,size_t content_size,wchar_t fill)

{
  wchar_t wVar1;
  wchar_t *__first;
  wchar_t *__x;
  int in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  CharPtr content;
  wchar_t fill_char;
  size_t left_padding;
  size_t padding;
  wchar_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  
  __first = (wchar_t *)((ulong)in_ESI - in_RDX >> 1);
  wVar1 = internal::BasicCharTraits<wchar_t>::cast(in_ECX);
  std::uninitialized_fill_n<wchar_t*,unsigned_long,wchar_t>
            (__first,CONCAT44(wVar1,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0);
  __x = (wchar_t *)((long)__first * 4 + in_RDI);
  std::uninitialized_fill_n<wchar_t*,unsigned_long,wchar_t>
            (__first,CONCAT44(wVar1,in_stack_ffffffffffffffc8),__x);
  return __x;
}

Assistant:

typename BasicWriter<Char>::CharPtr
  BasicWriter<Char>::fill_padding(
    CharPtr buffer, unsigned total_size,
    std::size_t content_size, wchar_t fill) {
  std::size_t padding = total_size - content_size;
  std::size_t left_padding = padding / 2;
  Char fill_char = internal::CharTraits<Char>::cast(fill);
  std::uninitialized_fill_n(buffer, left_padding, fill_char);
  buffer += left_padding;
  CharPtr content = buffer;
  std::uninitialized_fill_n(buffer + content_size,
                            padding - left_padding, fill_char);
  return content;
}